

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fir1.cpp
# Opt level: O2

void __thiscall
Fir1::initWithVector(Fir1 *this,vector<double,_std::allocator<double>_> *_coefficients)

{
  pointer pdVar1;
  ulong uVar2;
  double *pdVar3;
  double *__s;
  unsigned_long i;
  ulong uVar4;
  
  pdVar1 = (_coefficients->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar2 = (long)(_coefficients->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar1;
  uVar4 = (long)uVar2 >> 3;
  uVar2 = -(ulong)(uVar4 >> 0x3d != 0) | uVar2;
  pdVar3 = (double *)operator_new__(uVar2);
  this->coefficients = pdVar3;
  __s = (double *)operator_new__(uVar2);
  memset(__s,0,uVar2);
  this->buffer = __s;
  this->taps = (uint)uVar4;
  for (uVar2 = 0; uVar4 != uVar2; uVar2 = uVar2 + 1) {
    pdVar3[uVar2] = pdVar1[uVar2];
    __s[uVar2] = 0.0;
  }
  return;
}

Assistant:

void Fir1::initWithVector(std::vector<double> _coefficients) {
	coefficients = new double[_coefficients.size()];
	buffer = new double[_coefficients.size()]();
	taps = ((unsigned int)_coefficients.size());
	for(unsigned long i=0;i<_coefficients.size();i++) {
		coefficients[i] = _coefficients[i];
		buffer[i] = 0;
	}
}